

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::RetentionTest_Method_Test::~RetentionTest_Method_Test
          (RetentionTest_Method_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RetentionTest, Method) {
  CheckOptionsMessageIsStrippedCorrectly(
      proto2_unittest::TopLevelMessage::descriptor()
          ->file()
          ->service(0)
          ->method(0)
          ->options()
          .GetExtension(proto2_unittest::method_option));
}